

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_connect_for_tx(tftp_state_data *state,tftp_event_t event)

{
  Curl_easy *data;
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  
  data = state->data;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
    Curl_infof(data,"%s","Connected for transmit");
  }
  state->state = TFTP_STATE_TX;
  CVar2 = tftp_set_timeouts(state);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  CVar2 = tftp_tx(state,event);
  return CVar2;
}

Assistant:

static CURLcode tftp_connect_for_tx(struct tftp_state_data *state,
                                    tftp_event_t event)
{
  CURLcode result;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  struct Curl_easy *data = state->data;

  infof(data, "%s", "Connected for transmit");
#endif
  state->state = TFTP_STATE_TX;
  result = tftp_set_timeouts(state);
  if(result)
    return result;
  return tftp_tx(state, event);
}